

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O3

size_t __thiscall spdlog::details::file_helper::size(file_helper *this)

{
  pointer pcVar1;
  size_t sVar2;
  undefined8 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->fd_ != (FILE *)0x0) {
    sVar2 = os::filesize(this->fd_);
    return sVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  pcVar1 = (this->_filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->_filename)._M_string_length);
  std::operator+(&local_60,"Cannot use size() on closed file ",&local_40);
  *puVar3 = &PTR__spdlog_ex_001e6c90;
  puVar3[1] = puVar3 + 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == &local_60.field_2) {
    *(undefined4 *)(puVar3 + 3) = local_60.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)puVar3 + 0x1c) = local_60.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(puVar3 + 4) = local_60.field_2._8_4_;
    *(undefined4 *)((long)puVar3 + 0x24) = local_60.field_2._12_4_;
  }
  else {
    puVar3[1] = local_60._M_dataplus._M_p;
    puVar3[3] = CONCAT44(local_60.field_2._M_allocated_capacity._4_4_,
                         local_60.field_2._M_allocated_capacity._0_4_);
  }
  puVar3[2] = local_60._M_string_length;
  local_60._M_string_length = 0;
  local_60.field_2._M_allocated_capacity._0_4_ =
       local_60.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  __cxa_throw(puVar3,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

size_t size() const
    {
        if (fd_ == nullptr)
        {
            throw spdlog_ex("Cannot use size() on closed file " + os::filename_to_str(_filename));
        }
        return os::filesize(fd_);
    }